

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

int __thiscall
helics::zeromq::ZmqCommsSS::replyToIncomingMessage(ZmqCommsSS *this,message_t *msg,socket_t *sock)

{
  bool bVar1;
  size_t in_RCX;
  socket_base *in_RDX;
  ActionMessage *in_RDI;
  int in_R8D;
  string str;
  ActionMessage resp;
  string str_1;
  ActionMessage reply;
  ActionMessage M;
  ActionMessage *in_stack_fffffffffffffd48;
  undefined1 local_2a0 [12];
  action_t in_stack_fffffffffffffd6c;
  ActionMessage *in_stack_fffffffffffffd70;
  void *in_stack_fffffffffffffd78;
  ActionMessage *in_stack_fffffffffffffd80;
  ActionMessage *in_stack_fffffffffffffda8;
  ActionMessage *in_stack_fffffffffffffe10;
  NetworkCommsInterface *in_stack_fffffffffffffe18;
  undefined1 local_1c8 [236];
  undefined4 local_dc;
  int local_d4;
  socket_base *local_20;
  int local_4;
  
  local_20 = in_RDX;
  zmq::message_t::data((message_t *)in_RDI);
  zmq::message_t::size((message_t *)in_RDI);
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
  bVar1 = isProtocolCommand(in_RDI);
  if (bVar1) {
    if (local_d4 == 0x16570bf) {
      local_4 = -1;
      local_dc = 1;
    }
    else {
      NetworkCommsInterface::generateReplyToIncomingMessage
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffffda8);
      zmq::detail::socket_base::send(local_20,(int)local_1c8,(void *)0x0,in_RCX,in_R8D);
      local_4 = 0;
      local_dc = 1;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      ActionMessage::~ActionMessage(in_RDI);
    }
  }
  else {
    std::function<void_(helics::ActionMessage_&&)>::operator()
              ((function<void_(helics::ActionMessage_&&)> *)in_RDI,in_stack_fffffffffffffd48);
    ActionMessage::ActionMessage(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffffda8);
    zmq::detail::socket_base::send(local_20,(int)local_2a0,(void *)0x0,in_RCX,in_R8D);
    local_4 = 0;
    local_dc = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    ActionMessage::~ActionMessage(in_RDI);
  }
  ActionMessage::~ActionMessage(in_RDI);
  return local_4;
}

Assistant:

int ZmqCommsSS::replyToIncomingMessage(zmq::message_t& msg, zmq::socket_t& sock)
{
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    if (isProtocolCommand(M)) {
        if (M.messageID == CLOSE_RECEIVER) {
            return (-1);
        }
        auto reply = generateReplyToIncomingMessage(M);
        auto str = reply.to_string();
        sock.send(str);
        return 0;
    }
    ActionCallback(std::move(M));
    ActionMessage resp(CMD_PRIORITY_ACK);
    auto str = resp.to_string();
    sock.send(str);
    return 0;
}